

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

string __thiscall mjs::string_object::string_value(string_object *this)

{
  undefined8 extraout_RDX;
  object *in_RSI;
  string sVar1;
  gc_heap_ptr<mjs::gc_string> local_28;
  string_object *this_local;
  
  this_local = this;
  object::heap(in_RSI);
  gc_heap_ptr_untracked<mjs::gc_string,_true>::track
            ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)&local_28,
             (gc_heap *)((long)&in_RSI[1]._vptr_object + 4));
  string::string((string *)this,&local_28);
  gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr(&local_28);
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string string_value() const {
        return value_.track(heap());
    }